

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

StructDef * __thiscall
flatbuffers::Parser::LookupStructThruParentNamespaces(Parser *this,string *id)

{
  _Base_ptr *pp_Var1;
  Namespace *pNVar2;
  const_iterator cVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Parser *unaff_R14;
  long lVar7;
  long lVar8;
  key_type local_68;
  Parser *local_48;
  ulong local_40;
  _Base_ptr local_38;
  
  if ((this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pNVar2 = this->current_namespace_;
    lVar4 = (long)(pNVar2->components).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pNVar2->components).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 5;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      lVar8 = lVar4 + -1;
      uVar5 = (ulong)(lVar8 == 0);
      local_48 = this;
      if (lVar8 != 0) {
        lVar7 = 8;
        lVar6 = lVar8;
        do {
          std::__cxx11::string::_M_append
                    ((char *)&local_68,
                     *(ulong *)((long)(pNVar2->components).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8));
          std::__cxx11::string::push_back((char)&local_68);
          lVar7 = lVar7 + 0x20;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        local_38 = &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header;
        lVar4 = lVar4 * 0x20 + -0x38;
        uVar5 = 0;
        do {
          std::__cxx11::string::_M_append((char *)&local_68,(ulong)(id->_M_dataplus)._M_p);
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                          *)&this->structs_,&local_68);
          if (cVar3._M_node == local_38) {
            unaff_R14 = (Parser *)0x0;
          }
          else {
            unaff_R14 = *(Parser **)(cVar3._M_node + 2);
          }
          local_40 = uVar5;
          if (unaff_R14 != (Parser *)0x0) break;
          std::__cxx11::string::resize
                    ((ulong)&local_68,
                     (~(byte)*(undefined8 *)
                              ((long)&(((pNVar2->components).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar4) + (char)local_68._M_string_length) -
                     (char)id->_M_string_length);
          lVar4 = lVar4 + -0x20;
          lVar8 = lVar8 + -1;
          uVar5 = (ulong)(lVar8 == 0);
          unaff_R14 = this;
        } while (lVar8 != 0);
      }
      if (uVar5 != 0) {
        if (local_68._M_string_length != 0) {
          __assert_fail("full_name.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                        ,0xa0,
                        "T *flatbuffers::(anonymous namespace)::LookupTableByName(const SymbolTable<T> &, const std::string &, const Namespace &, size_t) [T = flatbuffers::StructDef]"
                       );
        }
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                        *)&this->structs_,id);
        if ((_Rb_tree_header *)cVar3._M_node ==
            &(local_48->structs_).dict._M_t._M_impl.super__Rb_tree_header) {
          unaff_R14 = (Parser *)0x0;
        }
        else {
          unaff_R14 = *(Parser **)(cVar3._M_node + 2);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010a6cf;
    }
  }
  unaff_R14 = (Parser *)0x0;
LAB_0010a6cf:
  if (unaff_R14 != (Parser *)0x0) {
    pp_Var1 = &(unaff_R14->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
  }
  return (StructDef *)unaff_R14;
}

Assistant:

StructDef *Parser::LookupStructThruParentNamespaces(
    const std::string &id) const {
  auto sd = LookupTableByName(structs_, id, *current_namespace_, 1);
  if (sd) sd->refcount++;
  return sd;
}